

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void __thiscall SimpleLoggerMgr::flushCriticalInfo(SimpleLoggerMgr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong __val;
  bool bVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  ostream *poVar6;
  ulong uVar7;
  size_type *psVar8;
  string msg;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  char *local_48;
  uint local_40;
  char local_38 [16];
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68," === Critical info (given by user): ","");
  __val = (this->globalCriticalInfo)._M_string_length;
  cVar4 = '\x01';
  if (9 < __val) {
    uVar7 = __val;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar7 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001d44ed;
      }
      if (uVar7 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001d44ed;
      }
      if (uVar7 < 10000) goto LAB_001d44ed;
      bVar2 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001d44ed:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_48,local_40,__val);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
  paVar1 = &local_88.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_88.field_2._M_allocated_capacity = *psVar8;
    local_88.field_2._8_8_ = plVar5[3];
    local_88._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar8;
    local_88._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_88._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  std::__cxx11::string::append((char *)&local_68);
  if ((this->globalCriticalInfo)._M_string_length != 0) {
    std::operator+(&local_88,"\n",&this->globalCriticalInfo);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  flushAllLoggers(this,2,&local_68);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->crashDumpFile,local_68._M_dataplus._M_p,
                        local_68._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    plVar5 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::flushCriticalInfo() {
    std::string msg = " === Critical info (given by user): ";
    msg += std::to_string(globalCriticalInfo.size()) + " bytes";
    msg += " ===";
    if (!globalCriticalInfo.empty()) {
        msg += "\n" + globalCriticalInfo;
    }
    flushAllLoggers(2, msg);
    if (crashDumpFile.is_open()) {
        crashDumpFile << msg << std::endl << std::endl;
    }
}